

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtr_mgr.c
# Opt level: O0

int rtr_mgr_start(rtr_mgr_config *config)

{
  long lVar1;
  int iVar2;
  rtr_mgr_group *group;
  long in_FS_OFFSET;
  rtr_mgr_group *best_group;
  rtr_mgr_config *config_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lrtr_dbg("RTR_MGR: %s()","rtr_mgr_start");
  group = rtr_mgr_get_first_group(config);
  iVar2 = rtr_mgr_start_sockets(group);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

RTRLIB_EXPORT int rtr_mgr_start(struct rtr_mgr_config *config)
{
	MGR_DBG("%s()", __func__);
	struct rtr_mgr_group *best_group = rtr_mgr_get_first_group(config);

	return rtr_mgr_start_sockets(best_group);
}